

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)

{
  byte value;
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  pointer puVar5;
  bool bVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)&projection,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&image,value,0,0,(ImageTemplate<unsigned_char> *)&projection);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)&projection);
  uVar1 = rand();
  (*ProjectionProfile)(&projection,&image,(uVar1 & 1) == 0);
  uVar2 = image._height;
  if ((uVar1 & 1) == 0) {
    uVar2 = image._width;
    image._width = image._height;
  }
  lVar3 = (long)projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar3 >> 2 != (ulong)uVar2) {
    bVar6 = false;
    goto LAB_00143c06;
  }
  uVar2 = image._width * value;
  for (lVar4 = lVar3 >> 4; 0 < lVar4; lVar4 = lVar4 + -1) {
    puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar2 != *projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start) goto LAB_00143c00;
    if (uVar2 != projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[1]) {
      puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      goto LAB_00143c00;
    }
    if (uVar2 != projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[2]) {
      puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 2;
      goto LAB_00143c00;
    }
    if (uVar2 != projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[3]) {
      puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 3;
      goto LAB_00143c00;
    }
    projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    lVar3 = lVar3 + -0x10;
  }
  lVar3 = lVar3 >> 2;
  if (lVar3 == 1) {
LAB_00143be5:
    puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar2 == *projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start) {
      puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  else if (lVar3 == 2) {
LAB_00143bdd:
    puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar2 == *projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start) {
      projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      goto LAB_00143be5;
    }
  }
  else {
    puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((lVar3 == 3) &&
       (puVar5 = projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,
       uVar2 == *projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start)) {
      projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
      goto LAB_00143bdd;
    }
  }
LAB_00143c00:
  bVar6 = puVar5 == projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
LAB_00143c06:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&projection.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&image);
  return bVar6;
}

Assistant:

bool form1_ProjectionProfile(ProjectionProfileForm1 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection = ProjectionProfile( image, horizontal );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }